

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void left_amount_widget_set_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Object local_48;
  int local_3c;
  Am_Ptr pvStack_38;
  int left_control;
  am_loc_values *loc_values;
  int new_val;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object win;
  Am_Object *cmd_local;
  
  win.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(cmd,0x169,0);
  loc_values._0_4_ = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(&local_18,0xfa,0);
  pvStack_38 = Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_18,(ulong)Am_LEFT_HOW);
  pAVar2 = Am_Object::Get(&local_48,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::~Am_Object(&local_48);
  local_3c = iVar1;
  if (iVar1 == 10) {
    *(int *)((long)pvStack_38 + 0x10) = (int)loc_values;
  }
  else if (iVar1 == 0xb) {
    *(int *)((long)pvStack_38 + 0x14) = (int)loc_values;
  }
  else {
    if (1 < iVar1 - 0xcU) {
      if (iVar1 == 0xe) {
        *(int *)((long)pvStack_38 + 0x1c) = (int)loc_values;
        goto LAB_002bd5eb;
      }
      if (1 < iVar1 - 0xfU) {
        if ((iVar1 != 0x65) && (iVar1 != 0x66)) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar3 = std::operator<<(poVar3,"Bad type for left control ");
          this = (void *)std::ostream::operator<<(poVar3,local_3c);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        goto LAB_002bd5eb;
      }
    }
    *(int *)((long)pvStack_38 + 0x18) = (int)loc_values;
  }
LAB_002bd5eb:
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, left_amount_widget_set,
                 (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  int new_val = cmd.Get(Am_VALUE);
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  int left_control = win.Get_Object(Am_LEFT_HOW).Get(Am_VALUE);
  switch (left_control) {
  case am_change_equals:
    loc_values->left_equals = new_val;
    break;
  case am_change_offset:
    loc_values->left_offset = new_val;
    break;
  case am_ask_user_generalize:
    break; //shouldn't happen
  case am_ask_user_type:
    break; //shouldn't happen
  case am_change_offset_centered:
    loc_values->left_centered = new_val;
    break;
  case am_change_offset_left_outside:
  case am_change_offset_left_inside:
  case am_change_offset_right_inside:
  case am_change_offset_right_outside:
    loc_values->left_object_offset = new_val;
    break;
  default:
    Am_ERROR("Bad type for left control " << left_control);
  } //end switch
}